

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

bool __thiscall
libebml::EbmlMaster::InsertElement(EbmlMaster *this,EbmlElement *element,EbmlElement *before)

{
  bool bVar1;
  bool bVar2;
  reference ppEVar3;
  EbmlElement *local_50;
  const_iterator local_48;
  __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_40;
  __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_38;
  __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_30;
  iterator Itr;
  EbmlElement *before_local;
  EbmlElement *element_local;
  EbmlMaster *this_local;
  
  Itr._M_current = (EbmlElement **)before;
  local_30._M_current =
       (EbmlElement **)
       std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::begin
                 (&this->ElementList);
  while( true ) {
    local_38._M_current =
         (EbmlElement **)
         std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::end
                   (&this->ElementList);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    bVar2 = false;
    if (bVar1) {
      ppEVar3 = __gnu_cxx::
                __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                ::operator*(&local_30);
      bVar2 = *ppEVar3 != (EbmlElement *)Itr._M_current;
    }
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
    ::operator++(&local_30);
  }
  local_40._M_current =
       (EbmlElement **)
       std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::end
                 (&this->ElementList);
  bVar2 = __gnu_cxx::operator==(&local_30,&local_40);
  if (!bVar2) {
    __gnu_cxx::
    __normal_iterator<libebml::EbmlElement*const*,std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>>
    ::__normal_iterator<libebml::EbmlElement**>
              ((__normal_iterator<libebml::EbmlElement*const*,std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>>
                *)&local_48,&local_30);
    local_50 = element;
    std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::insert
              (&this->ElementList,local_48,&local_50);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool EbmlMaster::InsertElement(EbmlElement & element, const EbmlElement & before)
{
  std::vector<EbmlElement *>::iterator Itr = ElementList.begin();
  while (Itr != ElementList.end() && *Itr != &before)
  {
    ++Itr;
  }
  if (Itr == ElementList.end())
    return false;

  ElementList.insert(Itr, &element);
  return true;
}